

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

bool __thiscall
siamese::DecoderPacketWindow::GrowWindow(DecoderPacketWindow *this,uint windowElementEnd)

{
  bool bVar1;
  DecoderSubwindow *__s;
  long lVar2;
  uint elements;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  uVar3 = (this->Subwindows).Size;
  lVar4 = (long)(int)uVar3;
  elements = windowElementEnd + 0x47 >> 6;
  if (uVar3 < elements) {
    bVar1 = pktalloc::LightVector<siamese::DecoderSubwindow_*,_25U>::SetSize_Copy
                      (&this->Subwindows,elements);
    if (!bVar1) {
      return false;
    }
    while (uVar3 < elements) {
      __s = (DecoderSubwindow *)pktalloc::Allocator::Allocate(this->TheAllocator,0x610);
      if (__s == (DecoderSubwindow *)0x0) {
        __s = (DecoderSubwindow *)0x0;
      }
      else {
        memset(__s,0,0x610);
        lVar2 = 0x40;
        auVar5 = vpbroadcastq_avx512f();
        auVar6 = vpmovzxbq_avx512f(ZEXT816(0xa890786048301800));
        auVar7 = vpbroadcastq_avx512f(ZEXT816(0xc0));
        do {
          auVar8 = vpaddq_avx512f(auVar5,auVar6);
          vpscatterqq_avx512f(ZEXT864(__s) + auVar6,0xffff,ZEXT1664((undefined1  [16])0x0));
          auVar9 = auVar8._0_32_;
          auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          vpscatterqd_avx512f(ZEXT832(8) + auVar9,0xffff,auVar10);
          vpscatterqd_avx512f(ZEXT832(0x10) + auVar9,0xffff,auVar10);
          vpscatterqd_avx512f(ZEXT832(0x14) + auVar9,0xffff,auVar10);
          auVar6 = vpaddq_avx512f(auVar6,auVar7);
          lVar2 = lVar2 + -8;
        } while (lVar2 != 0);
        (__s->Got).Words[0] = 0;
        __s->GotCount = 0;
      }
      if (__s == (DecoderSubwindow *)0x0) {
        return false;
      }
      (this->Subwindows).DataPtr[lVar4] = __s;
      lVar4 = lVar4 + 1;
      uVar3 = (uint)lVar4;
    }
  }
  if (this->Count < windowElementEnd) {
    this->Count = windowElementEnd;
  }
  return true;
}

Assistant:

bool DecoderPacketWindow::GrowWindow(const unsigned windowElementEnd)
{
    // Note: Adding a buffer of lane count to create space ahead for snapshots
    // as a subwindow is filled and we need to store its snapshot
    const unsigned subwindowCount   = Subwindows.GetSize();
    const unsigned subwindowsNeeded = (windowElementEnd + kColumnLaneCount + kSubwindowSize - 1) / kSubwindowSize;

    if (subwindowsNeeded > subwindowCount)
    {
        // Note resizing larger will keep old data in the vector
        if (!Subwindows.SetSize_Copy(subwindowsNeeded))
            return false;

        // For each subwindow to initialize:
        for (unsigned i = subwindowCount; i < subwindowsNeeded; ++i)
        {
            DecoderSubwindow* subwindow = TheAllocator->Construct<DecoderSubwindow>();
            if (!subwindow)
                return false; // Out of memory

            Subwindows.GetRef(i) = subwindow;
        }
    }

    // If this element expands the window:
    if (windowElementEnd > Count)
        Count = windowElementEnd;

    return true;
}